

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.c
# Opt level: O0

int demo_color_proc(DEMO_MENU *item,int msg,int extra)

{
  void *pvVar1;
  bool bVar2;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint in_EDX;
  int in_ESI;
  int iVar11;
  long in_RDI;
  undefined4 uVar12;
  undefined8 in_XMM1_Qa;
  ulong uVar13;
  ulong uVar14;
  undefined8 uVar15;
  int slider_width;
  int changed;
  int rgb [3];
  ALLEGRO_COLOR col2;
  ALLEGRO_COLOR col1;
  int c;
  int i;
  int cx;
  int cw;
  int h;
  int x;
  int in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  int in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe84;
  uint local_170;
  uint local_16c;
  undefined8 local_ec;
  undefined8 local_e4;
  undefined8 local_dc;
  undefined8 local_d4;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_74;
  undefined4 uStack_70;
  uint local_64;
  uint local_60;
  uint local_5c;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  uint local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  uint local_18;
  long local_10;
  
  bVar2 = false;
  iVar4 = screen_width / 0x12;
  iVar5 = iVar4 + -4;
  local_10 = in_RDI;
  if (in_ESI == 1) {
    local_18 = in_EDX;
    if ((*(uint *)(in_RDI + 0x10) & 2) == 0) {
      local_48 = al_map_rgb(0xff,0xff);
      uStack_94 = (undefined4)in_XMM1_Qa;
      uStack_90 = (undefined4)((ulong)in_XMM1_Qa >> 0x20);
      uStack_40 = uStack_94;
      uStack_3c = uStack_90;
      local_58 = al_map_rgb(0xff,0xff);
      local_50 = in_XMM1_Qa;
    }
    else {
      local_48 = al_map_rgb(0xff,0xff,0);
      uStack_74 = (undefined4)in_XMM1_Qa;
      uStack_70 = (undefined4)((ulong)in_XMM1_Qa >> 0x20);
      uStack_40 = uStack_74;
      uStack_3c = uStack_70;
      local_58 = al_map_rgb(0xff,0xff);
      local_50 = in_XMM1_Qa;
    }
    local_1c = screen_width / 2 - ((0xc - (iVar5 * 3 + 0xc >> 0x1f)) + iVar5 * 3 >> 1);
    local_20 = al_get_font_line_height(demo_data[1].dat);
    uVar14 = CONCAT44(uStack_3c,uStack_40);
    shadow_textprintf((undefined4)local_48,(int)demo_data[1].dat,(int)(ulong)(local_1c - 8),
                      (ulong)local_18,1,*(char **)(local_10 + 8));
    local_30 = **(uint **)(local_10 + 0x18);
    local_64 = local_30 & 0xff;
    local_60 = (int)local_30 >> 8 & 0xff;
    local_5c = (int)local_30 >> 0x10 & 0xff;
    for (local_2c = 0; local_2c < 3; local_2c = local_2c + 1) {
      local_24 = 4;
      local_28 = (int)((iVar4 + -0xc) * (&local_64)[local_2c]) / 0xff;
      iVar6 = local_1c + 2;
      iVar7 = local_18 + 5;
      iVar10 = local_1c + 2;
      iVar8 = (local_18 - 1) + local_20;
      uVar15 = al_map_rgb(0,0);
      uVar13 = (ulong)(uint)(float)iVar7;
      al_draw_rectangle((float)iVar6,uVar13,(float)(iVar10 + iVar5),(float)iVar8,uVar15,uVar14,
                        0x3f800000);
      iVar11 = local_1c + local_28;
      iVar6 = local_1c + 3 + local_28;
      iVar7 = local_18 + 6;
      iVar10 = local_24 + 3;
      iVar8 = (local_18 - 4) + local_20;
      uVar15 = al_map_rgb(0,0);
      al_draw_filled_rectangle
                ((float)iVar6,(float)iVar7,(float)(iVar10 + iVar11),(float)iVar8,uVar15,uVar13);
      if (*(int *)(local_10 + 0x14) == local_2c) {
        local_dc = local_48;
        local_d4 = CONCAT44(uStack_3c,uStack_40);
      }
      else {
        local_dc = local_58;
        local_d4 = local_50;
      }
      al_draw_rectangle((float)local_1c,(float)(int)(local_18 + 3),(float)(local_1c + iVar5),
                        (float)(int)(local_18 + local_20 + -3),local_dc,local_d4,0x3f800000);
      if (*(int *)(local_10 + 0x14) == local_2c) {
        local_ec = local_48;
        local_e4 = CONCAT44(uStack_3c,uStack_40);
      }
      else {
        local_ec = local_58;
        local_e4 = local_50;
      }
      uVar14 = (ulong)(uint)(float)(int)(local_18 + 5);
      al_draw_filled_rectangle
                ((float)(local_1c + 2 + local_28),uVar14,(float)(local_1c + 2 + local_28 + local_24)
                 ,(float)(int)(local_18 + local_20 + -5),local_ec,local_e4);
      local_1c = iVar4 + local_1c;
    }
    snprintf(demo_color_proc::buf,0x40,"%d,%d,%d",(ulong)local_64,(ulong)local_60,(ulong)local_5c);
    pvVar1 = demo_data[1].dat;
    uVar9 = local_1c + 8;
    uVar12 = al_map_rgb((undefined1)local_64,(undefined1)local_60,(undefined1)local_5c);
    shadow_textprintf(uVar12,(int)uVar14,(int)pvVar1,(ulong)uVar9,(int)(ulong)local_18,(char *)0x0,
                      demo_color_proc::buf);
  }
  else if (in_ESI == 3) {
    local_30 = **(uint **)(in_RDI + 0x18);
    local_64 = local_30 & 0xff;
    local_60 = (int)local_30 >> 8 & 0xff;
    local_5c = (int)local_30 >> 0x10 & 0xff;
    _Var3 = key_pressed(0x52);
    if ((_Var3) && (0 < (int)(&local_64)[*(int *)(local_10 + 0x14)])) {
      _Var3 = key_down(0xd7);
      if ((_Var3) || (_Var3 = key_down(0xd8), _Var3)) {
        (&local_64)[*(int *)(local_10 + 0x14)] = (&local_64)[*(int *)(local_10 + 0x14)] - 1;
      }
      else {
        (&local_64)[*(int *)(local_10 + 0x14)] = (&local_64)[*(int *)(local_10 + 0x14)] - 0x10;
        if ((int)(&local_64)[*(int *)(local_10 + 0x14)] < 0) {
          local_16c = 0;
        }
        else {
          local_16c = (&local_64)[*(int *)(local_10 + 0x14)];
        }
        (&local_64)[*(int *)(local_10 + 0x14)] = local_16c;
      }
      bVar2 = true;
    }
    _Var3 = key_pressed(0x53);
    if ((_Var3) && ((int)(&local_64)[*(int *)(local_10 + 0x14)] < 0xff)) {
      _Var3 = key_down(0xd7);
      if ((_Var3) || (_Var3 = key_down(0xd8), _Var3)) {
        (&local_64)[*(int *)(local_10 + 0x14)] = (&local_64)[*(int *)(local_10 + 0x14)] + 1;
      }
      else {
        (&local_64)[*(int *)(local_10 + 0x14)] = (&local_64)[*(int *)(local_10 + 0x14)] + 0x10;
        if ((int)(&local_64)[*(int *)(local_10 + 0x14)] < 0x100) {
          local_170 = (&local_64)[*(int *)(local_10 + 0x14)];
        }
        else {
          local_170 = 0xff;
        }
        (&local_64)[*(int *)(local_10 + 0x14)] = local_170;
      }
      bVar2 = true;
    }
    _Var3 = key_pressed(0x40);
    if (_Var3) {
      _Var3 = key_down(0xd7);
      if ((_Var3) || (_Var3 = key_down(0xd8), _Var3)) {
        *(int *)(local_10 + 0x14) = *(int *)(local_10 + 0x14) + -1;
        if (*(int *)(local_10 + 0x14) < 0) {
          *(int *)(local_10 + 0x14) = *(int *)(local_10 + 0x14) + 3;
        }
      }
      else {
        *(int *)(local_10 + 0x14) = *(int *)(local_10 + 0x14) + 1;
        *(int *)(local_10 + 0x14) = *(int *)(local_10 + 0x14) % 3;
      }
      play_sound_id(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
                    in_stack_fffffffffffffe78,0);
      if (*(long *)(local_10 + 0x20) != 0) {
        (**(code **)(local_10 + 0x20))(local_10);
      }
    }
    if (bVar2) {
      **(int **)(local_10 + 0x18) = local_64 + local_60 * 0x100 + local_5c * 0x10000;
      play_sound_id(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
                    in_stack_fffffffffffffe78,0);
      if (*(long *)(local_10 + 0x20) != 0) {
        (**(code **)(local_10 + 0x20))(local_10);
      }
    }
  }
  else {
    if (in_ESI == 4) {
      iVar5 = al_get_text_width(demo_data[1].dat,*(undefined8 *)(in_RDI + 8));
      iVar5 = iVar5 * 2 + 0x10 + iVar4 * 3;
      iVar10 = iVar4 * 3 + 0x10;
      iVar6 = al_get_text_width(demo_data[1].dat,"255,255,255");
      if (iVar10 + iVar6 * 2 < iVar5) {
        iVar5 = al_get_text_width(demo_data[1].dat,*(undefined8 *)(local_10 + 8));
        return iVar5 * 2 + 0x10 + iVar4 * 3;
      }
      iVar4 = iVar4 * 3 + 0x10;
      iVar5 = al_get_text_width(demo_data[1].dat,"255,255,255");
      return iVar4 + iVar5 * 2;
    }
    if (in_ESI == 5) {
      iVar4 = al_get_font_line_height(demo_data[1].dat);
      return iVar4;
    }
  }
  return 1000;
}

Assistant:

int demo_color_proc(DEMO_MENU * item, int msg, int extra)
{
   int x, h, cw, cx, i, c;
   ALLEGRO_COLOR col1, col2;
   int rgb[3];
   static char buf[64];
   int changed = 0;
   int slider_width = screen_width / 6;

   slider_width /= 3;
   slider_width -= 4;

   if (msg == DEMO_MENU_MSG_DRAW) {
      if (item->flags & DEMO_MENU_SELECTED) {
         col1 = al_map_rgb(255, 255, 0);
         col2 = al_map_rgb(255, 255, 255);
      } else {
         col1 = al_map_rgb(255, 255, 255);
         col2 = al_map_rgb(255, 255, 255);
      }

      x = screen_width / 2 - (slider_width + 4) * 3 / 2;
      h = al_get_font_line_height(demo_font);

      shadow_textprintf(demo_font, x - 8, extra, col1,
                      1, item->name);

      c = *(int *)(item->data);
      rgb[0] = c & 255;
      rgb[1] = (c >> 8) & 255;
      rgb[2] = (c >> 16) & 255;

      for (i = 0; i < 3; i++) {
         cw = 4;
         cx = (slider_width - 4 - cw) * rgb[i] / 255;

         al_draw_rectangle(x + 2, extra + 5,
              x + slider_width + 2, extra + h - 1, al_map_rgb(0, 0, 0), 1);
         al_draw_filled_rectangle(x + 3 + cx, extra + 6,
                  x + 3 + cx + cw, extra + h - 4, al_map_rgb(0, 0, 0));

         al_draw_rectangle(x, extra + 3, x + slider_width,
              extra + h - 3, item->extra == i ? col1 : col2, 1);
         al_draw_filled_rectangle(x + 2 + cx, extra + 5,
                  x + 2 + cx + cw, extra + h - 5,
                  item->extra == i ? col1 : col2);

         x += slider_width + 4;
      }

      snprintf(buf, sizeof(buf), "%d,%d,%d", rgb[0], rgb[1], rgb[2]);
      shadow_textprintf(demo_font, x + 8, extra, al_map_rgb(rgb[0], rgb[1], rgb[2]), 0, buf);
   } else if (msg == DEMO_MENU_MSG_KEY) {
      c = *(int *)(item->data);

      rgb[0] = (c >> 0) & 255;
      rgb[1] = (c >> 8) & 255;
      rgb[2] = (c >> 16) & 255;
   
   

     if (key_pressed(ALLEGRO_KEY_LEFT)) {
         if (rgb[item->extra] > 0) {
            if (key_down(ALLEGRO_KEY_LSHIFT) || key_down(ALLEGRO_KEY_RSHIFT)) {
               --rgb[item->extra];
            } else {
               rgb[item->extra] -= 16;
               rgb[item->extra] = MAX(0, rgb[item->extra]);
            }

            changed = 1;
         }
      }

      if (key_pressed(ALLEGRO_KEY_RIGHT)) {
         if (rgb[item->extra] < 255) {
            if (key_down(ALLEGRO_KEY_LSHIFT) || key_down(ALLEGRO_KEY_RSHIFT)) {
               ++rgb[item->extra];
            } else {
               rgb[item->extra] += 16;
               rgb[item->extra] = MIN(255, rgb[item->extra]);
            }

            changed = 1;
         }
      }

      if (key_pressed(ALLEGRO_KEY_TAB)) {
         if (key_down(ALLEGRO_KEY_LSHIFT) || key_down(ALLEGRO_KEY_RSHIFT)) {
            --item->extra;
            if (item->extra < 0) {
               item->extra += 3;
            }
         } else {
            ++item->extra;
            item->extra %= 3;
         }
         play_sound_id(DEMO_SAMPLE_BUTTON, 255, 128, -freq_variation, 0);
         if (item->on_activate) {
            item->on_activate(item);
         }
      }

      if (changed) {
         *(int *)(item->data) = rgb[0] + (rgb[1] << 8) + (rgb[2] << 16);

         play_sound_id(DEMO_SAMPLE_BUTTON, 255, 128, -freq_variation, 0);

         if (item->on_activate) {
            item->on_activate(item);
         }
      }
   } else if (msg == DEMO_MENU_MSG_WIDTH) {
      return MAX(al_get_text_width(demo_font, item->name) * 2 + 8 * 2 +
                 3 * (slider_width + 4),
                 8 * 2 + 3 * (slider_width + 4) +
                 2 * al_get_text_width(demo_font, "255,255,255"));
   } else if (msg == DEMO_MENU_MSG_HEIGHT) {
      return al_get_font_line_height(demo_font);
   }

   return DEMO_MENU_CONTINUE;
}